

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int arenas_lookup_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                     size_t newlen)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  rtree_ctx_t *ctx;
  long lVar10;
  ulong uVar11;
  rtree_leaf_elm_t *prVar12;
  size_t __n;
  uint arena_ind;
  
  malloc_mutex_lock((tsdn_t *)tsd,&ctl_mtx);
  iVar9 = 0x16;
  if (newp == (void *)0x0) {
    uVar11 = 0;
  }
  else {
    if (newlen != 8) goto LAB_00e5e548;
    uVar11 = *newp;
  }
  if (tsd == (tsd_t *)0x0) {
    ctx = (rtree_ctx_t *)&arena_ind;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar7 = uVar11 & 0xffffffffc0000000;
  uVar8 = (ulong)(((uint)(uVar11 >> 0x1e) & 0xf) << 4);
  puVar1 = (ulong *)((long)&ctx->cache[0].leafkey + uVar8);
  uVar8 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar8);
  if (uVar8 == uVar7) {
    prVar12 = (rtree_leaf_elm_t *)((ulong)((uint)(uVar11 >> 9) & 0x1ffff8) + puVar1[1]);
  }
  else if (ctx->l2_cache[0].leafkey == uVar7) {
    prVar12 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = uVar8;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
    *puVar1 = uVar7;
    puVar1[1] = (ulong)prVar12;
    prVar12 = (rtree_leaf_elm_t *)
              ((long)&(prVar12->le_bits).repr + (ulong)((uint)uVar11 >> 9 & 0x1ffff8));
  }
  else {
    for (lVar10 = 0x118; lVar10 != 0x188; lVar10 = lVar10 + 0x10) {
      if (*(ulong *)((long)ctx->cache + lVar10 + -8) == uVar7) {
        uVar4 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar10);
        puVar2 = (undefined8 *)((long)ctx->cache + lVar10 + -0x18);
        uVar5 = puVar2[1];
        puVar3 = (undefined8 *)((long)ctx->cache + lVar10 + -8);
        *puVar3 = *puVar2;
        puVar3[1] = uVar5;
        *(ulong *)((long)ctx->cache + lVar10 + -0x18) = uVar8;
        *(ulong *)((long)(ctx->cache + -1) + lVar10) = puVar1[1];
        *puVar1 = uVar7;
        puVar1[1] = uVar4;
        prVar12 = (rtree_leaf_elm_t *)(((uint)uVar11 >> 9 & 0x1ffff8) + uVar4);
        goto LAB_00e5e4d5;
      }
    }
    prVar12 = duckdb_je_rtree_leaf_elm_lookup_hard
                        ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,ctx,uVar11,false,false);
  }
LAB_00e5e4d5:
  if (((prVar12 != (rtree_leaf_elm_t *)0x0) &&
      (puVar6 = (uint *)(((long)(prVar12->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80),
      puVar6 != (uint *)0x0)) && (duckdb_je_arenas[*puVar6 & 0xfff].repr != (void *)0x0)) {
    arena_ind = *(uint *)((long)duckdb_je_arenas[*puVar6 & 0xfff].repr + 0x13468);
    if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
      uVar11 = *oldlenp;
      if (uVar11 != 4) {
        __n = 4;
        if (uVar11 < 4) {
          __n = uVar11;
        }
        switchD_00917c1c::default(oldp,&arena_ind,__n);
        *oldlenp = __n;
        goto LAB_00e5e548;
      }
      *(uint *)oldp = arena_ind;
    }
    iVar9 = 0;
  }
LAB_00e5e548:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar9;
}

Assistant:

static int
arenas_lookup_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	unsigned arena_ind;
	void *ptr;
	emap_full_alloc_ctx_t alloc_ctx;
	bool ptr_not_present;
	arena_t *arena;

	ptr = NULL;
	ret = EINVAL;
	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	WRITE(ptr, void *);
	ptr_not_present = emap_full_alloc_ctx_try_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr,
		&alloc_ctx);
	if (ptr_not_present || alloc_ctx.edata == NULL) {
		goto label_return;
	}

	arena = arena_get_from_edata(alloc_ctx.edata);
	if (arena == NULL) {
		goto label_return;
	}

	arena_ind = arena_ind_get(arena);
	READ(arena_ind, unsigned);

	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}